

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_fc19c::BuildEngineImpl::RuleInfo::setComplete
          (RuleInfo *this,BuildEngineImpl *engine)

{
  Epoch EVar1;
  Timestamp TVar2;
  BuildEngineImpl *engine_local;
  RuleInfo *this_local;
  
  this->state = Complete;
  EVar1 = getCurrentEpoch(engine);
  (this->result).builtAt = EVar1;
  TVar2 = llbuild::basic::Clock::now();
  (this->result).end = TVar2;
  return;
}

Assistant:

void setComplete(const BuildEngineImpl* engine) {
      state = StateKind::Complete;
      // Note we do not push this change to the database. This is essentially a
      // mark we maintain to allow a lazy transition to Incomplete when the
      // timestamp is incremented.
      //
      // FIXME: This is a bit dubious, and wouldn't work anymore if we moved the
      // Result to being totally managed by the database. However, it is just a
      // matter of keeping an extra timestamp outside the Result to fix.
      result.builtAt = engine->getCurrentEpoch();
      result.end = basic::Clock::now();
    }